

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O3

int uprv_strnicmp_63(char *str1,char *str2,uint32_t n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  
  if (str1 == (char *)0x0) {
    bVar5 = str2 != (char *)0x0;
LAB_0029696e:
    return -(uint)bVar5;
  }
  if (str2 == (char *)0x0) {
    return 1;
  }
  if (n != 0) {
    lVar4 = 0;
    do {
      bVar1 = str1[lVar4];
      bVar2 = str2[lVar4];
      if (bVar1 == 0) {
        bVar5 = bVar2 != 0;
        goto LAB_0029696e;
      }
      if (bVar2 == 0) {
        return 1;
      }
      bVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar3 = bVar1;
      }
      bVar1 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar1 = bVar2;
      }
      if ((uint)bVar3 - (uint)bVar1 != 0) {
        return (uint)bVar3 - (uint)bVar1;
      }
      lVar4 = lVar4 + 1;
    } while (n != (uint32_t)lVar4);
  }
  return 0;
}

Assistant:

U_CAPI int U_EXPORT2
uprv_strnicmp(const char *str1, const char *str2, uint32_t n) {
    if(str1==NULL) {
        if(str2==NULL) {
            return 0;
        } else {
            return -1;
        }
    } else if(str2==NULL) {
        return 1;
    } else {
        /* compare non-NULL strings lexically with lowercase */
        int rc;
        unsigned char c1, c2;

        for(; n--;) {
            c1=(unsigned char)*str1;
            c2=(unsigned char)*str2;
            if(c1==0) {
                if(c2==0) {
                    return 0;
                } else {
                    return -1;
                }
            } else if(c2==0) {
                return 1;
            } else {
                /* compare non-zero characters with lowercase */
                rc=(int)(unsigned char)uprv_tolower(c1)-(int)(unsigned char)uprv_tolower(c2);
                if(rc!=0) {
                    return rc;
                }
            }
            ++str1;
            ++str2;
        }
    }

    return 0;
}